

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_get_compressed_image_par(fitsfile *infptr,int *status)

{
  float fVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FITSfile *pFVar7;
  long lVar8;
  fitsfile *pfVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int tstatus;
  fitsfile *local_100;
  int colNum;
  int doffset;
  int tstatus2;
  char value [71];
  char keyword [75];
  
  colNum = 0;
  if (0 < *status) {
    return *status;
  }
  iVar4 = ffgky(infptr,0x10,"ZCMPTYPE",value,(char *)0x0,status);
  if (iVar4 < 1) {
    infptr->Fptr->zcmptype[0] = '\0';
    strncat(infptr->Fptr->zcmptype,value,0xb);
    cVar3 = value[0];
    if (value[0] == 'G') {
      iVar4 = bcmp(value,"GZIP_1",7);
      if (iVar4 == 0) {
        iVar4 = 0x15;
      }
      else {
        iVar4 = bcmp(value,"GZIP_2",7);
        if (iVar4 != 0) goto LAB_001806ba;
        iVar4 = 0x16;
      }
    }
    else {
      if (value[0] == 'H') {
        iVar4 = bcmp(value,"HCOMPRESS_1",0xc);
        if (iVar4 == 0) {
          iVar4 = 0x29;
          goto LAB_00180751;
        }
      }
      else if (value[0] == 'R') {
        iVar5 = bcmp(value,"RICE_1",7);
        iVar4 = 0xb;
        if ((iVar5 == 0) || (iVar5 = bcmp(value,"RICE_ONE",9), iVar5 == 0)) goto LAB_00180751;
      }
LAB_001806ba:
      if (cVar3 == 'B' && CONCAT71(value._1_7_,value[0]) == 0x315f3250495a42) {
        iVar4 = 0x33;
      }
      else if (value[0] == 'N') {
        iVar4 = bcmp(value,"NOCOMPRESS",0xb);
        if (iVar4 != 0) goto LAB_0018071e;
        iVar4 = -1;
      }
      else {
        if ((((uint)CONCAT71(value._1_7_,value[0]) & 0xff) != 0x50) ||
           (iVar4 = bcmp(value,"PLIO_1",7), iVar4 != 0)) {
LAB_0018071e:
          ffpmsg("Unknown image compression type:");
          pcVar11 = value;
          goto LAB_0018072f;
        }
        iVar4 = 0x1f;
      }
    }
LAB_00180751:
    pFVar7 = infptr->Fptr;
    pFVar7->compress_type = iVar4;
    iVar4 = ffgky(infptr,0x1f,"ZBITPIX",&pFVar7->zbitpix,(char *)0x0,status);
    if (iVar4 < 1) {
      tstatus = 0;
      tstatus2 = 0;
      if (((infptr->Fptr->zbitpix < 0) &&
          (iVar4 = ffgcno(infptr,0,"ZZERO",&colNum,&tstatus), iVar4 == 0xdb)) &&
         (iVar4 = ffgcno(infptr,0,"ZSCALE",&colNum,&tstatus2), iVar4 == 0xdb)) {
LAB_00180875:
        infptr->Fptr->quantize_level = 9999.0;
      }
      else {
        tstatus = 0;
        iVar4 = ffgky(infptr,0x10,"ZQUANTIZ",value,(char *)0x0,&tstatus);
        if (iVar4 < 1) {
          if (value[0] == 'S') {
            iVar4 = bcmp(value,"SUBTRACTIVE_DITHER_1",0x15);
            if (iVar4 == 0) {
              infptr->Fptr->quantize_method = 1;
            }
            else {
              iVar4 = bcmp(value,"SUBTRACTIVE_DITHER_2",0x15);
              if (iVar4 != 0) goto LAB_001808bd;
              infptr->Fptr->quantize_method = 2;
            }
          }
          else {
            if (value[0] == 'N') {
              iVar4 = bcmp(value,"NONE",5);
              if (iVar4 == 0) goto LAB_00180875;
              iVar4 = bcmp(value,"NO_DITHER",10);
              if (iVar4 == 0) {
                infptr->Fptr->quantize_method = -1;
                goto LAB_001808c8;
              }
            }
LAB_001808bd:
            infptr->Fptr->quantize_method = 0;
          }
        }
        else {
          pFVar7 = infptr->Fptr;
          pFVar7->quantize_level = 0.0;
          pFVar7->quantize_method = 0;
        }
      }
LAB_001808c8:
      tstatus = 0;
      iVar4 = ffgky(infptr,0x1f,"ZDITHER0",&doffset,(char *)0x0,&tstatus);
      if (0 < iVar4) {
        doffset = 1;
      }
      pFVar7 = infptr->Fptr;
      pFVar7->dither_seed = doffset;
      iVar4 = ffgky(infptr,0x1f,"ZNAXIS",&pFVar7->zndim,(char *)0x0,status);
      if (iVar4 < 1) {
        pFVar7 = infptr->Fptr;
        uVar6 = pFVar7->zndim;
        if ((int)uVar6 < 1) {
          pcVar11 = "Compressed image has no data (ZNAXIS < 1)";
LAB_0018096b:
          ffpmsg(pcVar11);
          *status = 0xd4;
          return 0xd4;
        }
        if (6 < uVar6) {
          pcVar11 = "Compressed image has too many dimensions";
          goto LAB_0018096b;
        }
        lVar10 = 1;
        lVar8 = 0x440;
        lVar12 = lVar10;
        uVar13 = 0;
        local_100 = infptr;
        while (pfVar9 = local_100, (long)uVar13 < (long)(int)uVar6) {
          uVar14 = uVar13 + 1;
          snprintf(keyword,0x4b,"ZNAXIS%d",uVar14 & 0xffffffff);
          pfVar9 = local_100;
          ffgky(local_100,0x29,keyword,(void *)((long)local_100->Fptr->imgnaxis + lVar8 + -0x40),
                (char *)0x0,status);
          if (0 < *status) {
            pcVar11 = "required ZNAXISn compression keyword not found";
            goto LAB_0018092d;
          }
          snprintf(keyword,0x4b,"ZTILE%d",uVar14 & 0xffffffff);
          pFVar7 = pfVar9->Fptr;
          if (uVar13 == 0) {
            pFVar7->tilesize[0] = pFVar7->znaxis[0];
          }
          else {
            *(undefined8 *)((long)&pFVar7->filehandle + lVar8) = 1;
          }
          tstatus = 0;
          ffgky(pfVar9,0x29,keyword,(void *)((long)&pFVar7->filehandle + lVar8),(char *)0x0,&tstatus
               );
          pFVar7 = pfVar9->Fptr;
          lVar2 = *(long *)((long)&pFVar7->filehandle + lVar8);
          if (lVar2 == 0) {
            pcVar11 = "invalid ZTILE value = 0 in compressed image";
            goto LAB_0018072f;
          }
          lVar12 = lVar12 * ((*(long *)((long)pFVar7->imgnaxis + lVar8 + -0x40) + -1) / lVar2 + 1);
          lVar10 = lVar10 * lVar2;
          lVar8 = lVar8 + 8;
          uVar13 = uVar14;
          uVar6 = pFVar7->zndim;
        }
        if (lVar12 != pFVar7->numrows) {
          pcVar11 = "number of table rows != the number of tiles in compressed image";
          goto LAB_0018072f;
        }
        if (pFVar7->compress_type == 0x29) {
          iVar4 = ffgky(local_100,0x2a,"ZVAL1",&pFVar7->hcomp_scale,(char *)0x0,status);
          if (0 < iVar4) {
LAB_00180bdb:
            pcVar11 = "required ZVAL1 compression keyword not found";
            goto LAB_0018092d;
          }
          tstatus = 0;
          ffgky(pfVar9,0x1f,"ZVAL2",&pfVar9->Fptr->hcomp_smooth,(char *)0x0,&tstatus);
          pFVar7 = pfVar9->Fptr;
        }
        else if (pFVar7->compress_type == 0xb) {
          iVar4 = ffgky(local_100,0x1f,"ZVAL1",&pFVar7->rice_blocksize,(char *)0x0,status);
          if (0 < iVar4) goto LAB_00180bdb;
          tstatus = 0;
          iVar4 = ffgky(pfVar9,0x10,"ZNAME2",value,(char *)0x0,&tstatus);
          if ((iVar4 == 0) && (value[0] == 'N')) {
            iVar4 = bcmp(value,"NOISEBIT",9);
            tstatus = 0;
            if (iVar4 != 0) goto LAB_00180c1c;
LAB_00180c43:
            pFVar7 = pfVar9->Fptr;
            pFVar7->rice_bytepix = 4;
          }
          else {
LAB_00180c1c:
            tstatus = 0;
            iVar4 = ffgky(pfVar9,0x1f,"ZVAL2",&pfVar9->Fptr->rice_bytepix,(char *)0x0,&tstatus);
            if (0 < iVar4) goto LAB_00180c43;
            pFVar7 = pfVar9->Fptr;
          }
          pfVar9 = local_100;
          if ((pFVar7->rice_blocksize < 0x10) && (iVar4 = pFVar7->rice_bytepix, 8 < iVar4)) {
            pFVar7->rice_bytepix = pFVar7->rice_blocksize;
            pFVar7->rice_blocksize = iVar4;
            tstatus = iVar4;
          }
        }
        pFVar7->maxtilelen = lVar10;
        if (pFVar7->compress_type == 0xb && pFVar7->rice_blocksize == 0) {
          pcVar11 = "Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)";
LAB_0018072f:
          ffpmsg(pcVar11);
          *status = 0x19e;
          return 0x19e;
        }
        iVar4 = imcomp_calc_max_elem
                          (pFVar7->compress_type,(int)lVar10,pFVar7->zbitpix,pFVar7->rice_blocksize)
        ;
        pFVar7->maxelem = (long)iVar4;
        iVar4 = ffgcno(pfVar9,0,"COMPRESSED_DATA",&pFVar7->cn_compressed,status);
        if (0 < iVar4) {
          pcVar11 = "couldn\'t find COMPRESSED_DATA column (fits_get_compressed_img_par)";
          goto LAB_0018072f;
        }
        ffpmrk();
        tstatus = 0;
        ffgcno(pfVar9,0,"UNCOMPRESSED_DATA",&pfVar9->Fptr->cn_uncompressed,&tstatus);
        tstatus = 0;
        ffgcno(pfVar9,0,"GZIP_COMPRESSED_DATA",&pfVar9->Fptr->cn_gzip_data,&tstatus);
        tstatus = 0;
        iVar4 = ffgcno(pfVar9,0,"ZSCALE",&pfVar9->Fptr->cn_zscale,&tstatus);
        pFVar7 = pfVar9->Fptr;
        if (0 < iVar4) {
          tstatus = 0;
          iVar4 = ffgky(pfVar9,0x52,"ZSCALE",&pFVar7->zscale,(char *)0x0,&tstatus);
          pFVar7 = pfVar9->Fptr;
          pfVar9 = local_100;
          if (iVar4 < 1) {
            pFVar7->cn_zscale = -1;
          }
        }
        tstatus = 0;
        iVar4 = ffgcno(pfVar9,0,"ZZERO",&pFVar7->cn_zzero,&tstatus);
        pFVar7 = pfVar9->Fptr;
        if (0 < iVar4) {
          tstatus = 0;
          iVar4 = ffgky(pfVar9,0x52,"ZZERO",&pFVar7->zzero,(char *)0x0,&tstatus);
          pFVar7 = pfVar9->Fptr;
          pfVar9 = local_100;
          if (iVar4 < 1) {
            pFVar7->cn_zzero = -1;
          }
        }
        tstatus = 0;
        iVar4 = ffgcno(pfVar9,0,"ZBLANK",&pFVar7->cn_zblank,&tstatus);
        pFVar7 = pfVar9->Fptr;
        if (0 < iVar4) {
          tstatus = 0;
          iVar4 = ffgky(pfVar9,0x1f,"ZBLANK",&pFVar7->zblank,(char *)0x0,&tstatus);
          pfVar9 = local_100;
          if (iVar4 < 1) {
            pFVar7 = local_100->Fptr;
          }
          else {
            tstatus = 0;
            iVar4 = ffgky(local_100,0x1f,"BLANK",&local_100->Fptr->zblank,(char *)0x0,&tstatus);
            pFVar7 = pfVar9->Fptr;
            if (0 < iVar4) goto LAB_00180eae;
          }
          pFVar7->cn_zblank = -1;
        }
LAB_00180eae:
        tstatus = 0;
        iVar4 = ffgky(pfVar9,0x52,"BSCALE",&pFVar7->cn_bscale,(char *)0x0,&tstatus);
        pFVar7 = pfVar9->Fptr;
        if (0 < iVar4) {
          pFVar7->cn_bscale = 1.0;
        }
        tstatus = 0;
        iVar4 = ffgky(pfVar9,0x52,"BZERO",&pFVar7->cn_bzero,(char *)0x0,&tstatus);
        pFVar7 = pfVar9->Fptr;
        if (iVar4 < 1) {
          pFVar7->cn_actual_bzero = pFVar7->cn_bzero;
        }
        else {
          pFVar7->cn_bzero = 0.0;
          pFVar7->cn_actual_bzero = 0.0;
        }
        fVar1 = pFVar7->request_quantize_level;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          pFVar7->quantize_level = fVar1;
        }
        ffcmrk();
        goto LAB_00180932;
      }
      pcVar11 = "required ZNAXIS compression keyword not found";
    }
    else {
      pcVar11 = "required ZBITPIX compression keyword not found";
    }
  }
  else {
    ffpmsg("required ZCMPTYPE compression keyword not found in");
    pcVar11 = " imcomp_get_compressed_image_par";
  }
LAB_0018092d:
  ffpmsg(pcVar11);
LAB_00180932:
  return *status;
}

Assistant:

int imcomp_get_compressed_image_par(fitsfile *infptr, int *status)
 
/* 
    This routine reads keywords from a BINTABLE extension containing a
    compressed image.
*/
{
    char keyword[FLEN_KEYWORD];
    char value[FLEN_VALUE];
    int ii, tstatus, tstatus2, doffset, oldFormat=0, colNum=0;
    long expect_nrows, maxtilelen;

    if (*status > 0)
        return(*status);

    /* Copy relevant header keyword values to structure */
    if (ffgky (infptr, TSTRING, "ZCMPTYPE", value, NULL, status) > 0)
    {
        ffpmsg("required ZCMPTYPE compression keyword not found in");
        ffpmsg(" imcomp_get_compressed_image_par");
        return(*status);
    }

    (infptr->Fptr)->zcmptype[0] = '\0';
    strncat((infptr->Fptr)->zcmptype, value, 11);

    if (!FSTRCMP(value, "RICE_1") || !FSTRCMP(value, "RICE_ONE") )
        (infptr->Fptr)->compress_type = RICE_1;
    else if (!FSTRCMP(value, "HCOMPRESS_1") )
        (infptr->Fptr)->compress_type = HCOMPRESS_1;
    else if (!FSTRCMP(value, "GZIP_1") )
        (infptr->Fptr)->compress_type = GZIP_1;
    else if (!FSTRCMP(value, "GZIP_2") )
        (infptr->Fptr)->compress_type = GZIP_2;
    else if (!FSTRCMP(value, "BZIP2_1") )
        (infptr->Fptr)->compress_type = BZIP2_1;
    else if (!FSTRCMP(value, "PLIO_1") )
        (infptr->Fptr)->compress_type = PLIO_1;
    else if (!FSTRCMP(value, "NOCOMPRESS") )
        (infptr->Fptr)->compress_type = NOCOMPRESS;
    else
    {
        ffpmsg("Unknown image compression type:");
        ffpmsg(value);
	return (*status = DATA_DECOMPRESSION_ERR);
    }
    
    if (ffgky (infptr, TINT,  "ZBITPIX",  &(infptr->Fptr)->zbitpix,  
               NULL, status) > 0)
    {
        ffpmsg("required ZBITPIX compression keyword not found");
        return(*status);
    }

    /* If ZZERO and ZSCALE columns don't exist for floating-point types,
     assume there is NO quantization.  Treat exactly as if it had ZQUANTIZ='NONE'.
     This is true regardless of whether or not file has a ZQUANTIZ keyword. */
    tstatus=0;
    tstatus2=0;
    if ((infptr->Fptr->zbitpix < 0) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZZERO",&colNum,&tstatus)
	      == COL_NOT_FOUND) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZSCALE",&colNum,&tstatus2)
	      == COL_NOT_FOUND)) {
	  (infptr->Fptr)->quantize_level = NO_QUANTIZE;
    }
    else {
       /* get the floating point to integer quantization type, if present. */
       /* FITS files produced before 2009 will not have this keyword */
       tstatus = 0;
       if (ffgky(infptr, TSTRING, "ZQUANTIZ", value, NULL, &tstatus) > 0)
       {
           (infptr->Fptr)->quantize_method = 0;
           (infptr->Fptr)->quantize_level = 0;
       } else {

           if (!FSTRCMP(value, "NONE") ) {
               (infptr->Fptr)->quantize_level = NO_QUANTIZE;
	  } else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_1") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_1;
           else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_2") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_2;
           else if (!FSTRCMP(value, "NO_DITHER") )
               (infptr->Fptr)->quantize_method = NO_DITHER;
           else
               (infptr->Fptr)->quantize_method = 0;
       }
    }

    /* get the floating point quantization dithering offset, if present. */
    /* FITS files produced before October 2009 will not have this keyword */
    tstatus = 0;
    if (ffgky(infptr, TINT, "ZDITHER0", &doffset, NULL, &tstatus) > 0)
    {
	/* by default start with 1st element of random sequence */
        (infptr->Fptr)->dither_seed = 1;  
    } else {
        (infptr->Fptr)->dither_seed = doffset;
    }

    if (ffgky (infptr,TINT, "ZNAXIS", &(infptr->Fptr)->zndim, NULL, status) > 0)
    {
        ffpmsg("required ZNAXIS compression keyword not found");
        return(*status);
    }

    if ((infptr->Fptr)->zndim < 1)
    {
        ffpmsg("Compressed image has no data (ZNAXIS < 1)");
	return (*status = BAD_NAXIS);
    }

    if ((infptr->Fptr)->zndim > MAX_COMPRESS_DIM)
    {
        ffpmsg("Compressed image has too many dimensions");
        return(*status = BAD_NAXIS);
    }

    expect_nrows = 1;
    maxtilelen = 1;
    for (ii = 0;  ii < (infptr->Fptr)->zndim;  ii++)
    {
        /* get image size */
        snprintf (keyword, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
	ffgky (infptr, TLONG,keyword, &(infptr->Fptr)->znaxis[ii],NULL,status);

        if (*status > 0)
        {
            ffpmsg("required ZNAXISn compression keyword not found");
            return(*status);
        }

        /* get compression tile size */
	snprintf (keyword, FLEN_KEYWORD,"ZTILE%d", ii+1);

        /* set default tile size in case keywords are not present */
        if (ii == 0)
            (infptr->Fptr)->tilesize[0] = (infptr->Fptr)->znaxis[0];
        else
            (infptr->Fptr)->tilesize[ii] = 1;

        tstatus = 0;
	ffgky (infptr, TLONG, keyword, &(infptr->Fptr)->tilesize[ii], NULL, 
               &tstatus);
        if ((infptr->Fptr)->tilesize[ii] == 0)
        {
           ffpmsg("invalid ZTILE value = 0 in compressed image");
           return (*status = DATA_DECOMPRESSION_ERR);
        }
        expect_nrows *= (((infptr->Fptr)->znaxis[ii] - 1) / 
                  (infptr->Fptr)->tilesize[ii]+ 1);
        maxtilelen *= (infptr->Fptr)->tilesize[ii];
    }

    /* check number of rows */
    if (expect_nrows != (infptr->Fptr)->numrows)
    {
        ffpmsg(
        "number of table rows != the number of tiles in compressed image");
        return (*status = DATA_DECOMPRESSION_ERR);
    }

    /* read any algorithm specific parameters */
    if ((infptr->Fptr)->compress_type == RICE_1 )
    {
        if (ffgky(infptr, TINT,"ZVAL1", &(infptr->Fptr)->rice_blocksize,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        /* First check for very old files, where ZVAL2 wasn't yet designated
           for bytepix */
        if (!ffgky(infptr, TSTRING, "ZNAME2", value, NULL, &tstatus)
                && !FSTRCMP(value, "NOISEBIT"))
        {
            oldFormat = 1;
        }
                
        tstatus = 0;
        if (oldFormat || ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->rice_bytepix,
                  NULL, &tstatus) > 0)
        {
            (infptr->Fptr)->rice_bytepix = 4;  /* default value */
        }

        if ((infptr->Fptr)->rice_blocksize < 16 &&
	    (infptr->Fptr)->rice_bytepix > 8) {
	     /* values are reversed */
	     tstatus = (infptr->Fptr)->rice_bytepix;
	     (infptr->Fptr)->rice_bytepix = (infptr->Fptr)->rice_blocksize;
	     (infptr->Fptr)->rice_blocksize = tstatus;
        }
    } else if ((infptr->Fptr)->compress_type == HCOMPRESS_1 ) {

        if (ffgky(infptr, TFLOAT,"ZVAL1", &(infptr->Fptr)->hcomp_scale,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->hcomp_smooth,
                  NULL, &tstatus);
    }    

    /* store number of pixels in each compression tile, */
    /* and max size of the compressed tile buffer */
    (infptr->Fptr)->maxtilelen = maxtilelen;

    /* prevent possible divide by zero in imcomp_calc_max_elem */
    if ((infptr->Fptr)->compress_type == RICE_1 && 
        (infptr->Fptr)->rice_blocksize == 0)
    {
        ffpmsg("Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }
    (infptr->Fptr)->maxelem = 
           imcomp_calc_max_elem ((infptr->Fptr)->compress_type, maxtilelen, 
               (infptr->Fptr)->zbitpix, (infptr->Fptr)->rice_blocksize);

    /* Get Column numbers. */
    if (ffgcno(infptr, CASEINSEN, "COMPRESSED_DATA",
         &(infptr->Fptr)->cn_compressed, status) > 0)
    {
        ffpmsg("couldn't find COMPRESSED_DATA column (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    ffpmrk(); /* put mark on message stack; erase any messages after this */

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "UNCOMPRESSED_DATA",
          &(infptr->Fptr)->cn_uncompressed, &tstatus);

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "GZIP_COMPRESSED_DATA",
          &(infptr->Fptr)->cn_gzip_data, &tstatus);

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZSCALE", &(infptr->Fptr)->cn_zscale,
              &tstatus) > 0)
    {
        /* CMPSCALE column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZSCALE", &(infptr->Fptr)->zscale, NULL, 
                 &tstatus) <= 0)
            (infptr->Fptr)->cn_zscale = -1;  /* flag for a constant ZSCALE */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZZERO", &(infptr->Fptr)->cn_zzero,
               &tstatus) > 0)
    {
        /* CMPZERO column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZZERO", &(infptr->Fptr)->zzero, NULL, 
                  &tstatus) <= 0)
            (infptr->Fptr)->cn_zzero = -1;  /* flag for a constant ZZERO */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZBLANK", &(infptr->Fptr)->cn_zblank,
               &tstatus) > 0)
    {
        /* ZBLANK column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TINT, "ZBLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  {
            (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */

        } else {
           /* ZBLANK keyword doesn't exist; see if there is a BLANK keyword */
           tstatus = 0;
           if (ffgky(infptr, TINT, "BLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  
              (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }
    }

    /* read the conventional BSCALE and BZERO scaling keywords, if present */
    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BSCALE", &(infptr->Fptr)->cn_bscale, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bscale = 1.0;
    }

    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BZERO", &(infptr->Fptr)->cn_bzero, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bzero = 0.0;
        (infptr->Fptr)->cn_actual_bzero = 0.0;
    } else {
        (infptr->Fptr)->cn_actual_bzero = (infptr->Fptr)->cn_bzero;
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
    if ( (infptr->Fptr)->request_quantize_level != 0.)
        (infptr->Fptr)->quantize_level = (infptr->Fptr)->request_quantize_level;

    ffcmrk();  /* clear any spurious error messages, back to the mark */
    return (*status);
}